

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O0

void __thiscall Threadpool<Searchthread>::Threadpool(Threadpool<Searchthread> *this)

{
  Threadpool<Searchthread> *this_local;
  
  std::vector<Searchthread_*,_std::allocator<Searchthread_*>_>::vector(&this->workers);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::deque(&this->tasks);
  std::mutex::mutex(&this->m);
  std::condition_variable::condition_variable(&this->cv_task);
  std::condition_variable::condition_variable(&this->cv_finished);
  std::atomic<unsigned_int>::atomic(&this->busy);
  std::atomic<unsigned_int>::atomic(&this->processed);
  std::atomic<bool>::atomic(&this->stop);
  return;
}

Assistant:

Threadpool() { }